

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.cpp
# Opt level: O2

void anon_unknown.dwarf_15bad7::Equalizer_getParamf(EffectProps *props,ALenum param,float *val)

{
  effect_exception *this;
  
  switch(param) {
  case 1:
    props = (EffectProps *)&(props->Reverb).Diffusion;
    break;
  case 2:
    break;
  case 3:
    props = (EffectProps *)&(props->Reverb).GainHF;
    break;
  case 4:
    props = (EffectProps *)&(props->Reverb).Gain;
    break;
  case 5:
    props = (EffectProps *)&(props->Reverb).DecayTime;
    break;
  case 6:
    props = (EffectProps *)&(props->Reverb).ReflectionsGain;
    break;
  case 7:
    props = (EffectProps *)&(props->Reverb).DecayHFRatio;
    break;
  case 8:
    props = (EffectProps *)&(props->Reverb).ReflectionsDelay;
    break;
  case 9:
    props = (EffectProps *)&(props->Reverb).LateReverbDelay;
    break;
  case 10:
    props = (EffectProps *)&(props->Reverb).LateReverbGain;
    break;
  default:
    this = (effect_exception *)__cxa_allocate_exception(0x30);
    effect_exception::effect_exception
              (this,0xa002,"Invalid equalizer float property 0x%04x",(ulong)(uint)param);
    __cxa_throw(this,&effect_exception::typeinfo,al::base_exception::~base_exception);
  }
  *val = (props->Reverb).Density;
  return;
}

Assistant:

void Equalizer_getParamf(const EffectProps *props, ALenum param, float *val)
{
    switch(param)
    {
    case AL_EQUALIZER_LOW_GAIN:
        *val = props->Equalizer.LowGain;
        break;

    case AL_EQUALIZER_LOW_CUTOFF:
        *val = props->Equalizer.LowCutoff;
        break;

    case AL_EQUALIZER_MID1_GAIN:
        *val = props->Equalizer.Mid1Gain;
        break;

    case AL_EQUALIZER_MID1_CENTER:
        *val = props->Equalizer.Mid1Center;
        break;

    case AL_EQUALIZER_MID1_WIDTH:
        *val = props->Equalizer.Mid1Width;
        break;

    case AL_EQUALIZER_MID2_GAIN:
        *val = props->Equalizer.Mid2Gain;
        break;

    case AL_EQUALIZER_MID2_CENTER:
        *val = props->Equalizer.Mid2Center;
        break;

    case AL_EQUALIZER_MID2_WIDTH:
        *val = props->Equalizer.Mid2Width;
        break;

    case AL_EQUALIZER_HIGH_GAIN:
        *val = props->Equalizer.HighGain;
        break;

    case AL_EQUALIZER_HIGH_CUTOFF:
        *val = props->Equalizer.HighCutoff;
        break;

    default:
        throw effect_exception{AL_INVALID_ENUM, "Invalid equalizer float property 0x%04x", param};
    }
}